

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void __thiscall Json::StyledStreamWriter::writeWithIndent(StyledStreamWriter *this,string *value)

{
  if ((this->field_0x68 & 2) == 0) {
    writeIndent(this);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (this->document_,(value->_M_dataplus)._M_p,value->_M_string_length);
  this->field_0x68 = this->field_0x68 & 0xfd;
  return;
}

Assistant:

void StyledStreamWriter::writeWithIndent(const JSONCPP_STRING& value) {
  if (!indented_) writeIndent();
  *document_ << value;
  indented_ = false;
}